

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  int width;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long v;
  double dVar9;
  char local_3a [2];
  double local_38;
  
  width = 0xf;
  if (unit.prec < 0xf) {
    width = unit.prec;
  }
  local_38 = 0.0;
  dVar9 = modf(n,&local_38);
  dVar9 = round(dVar9 * unit.pow10);
  v = (long)dVar9;
  if ((long)local_38 != 0 || v != 0) {
    uVar8 = 0xffffffff;
    lVar3 = (long)local_38;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      local_3a[uVar6 + 1] = (char)lVar3 + (char)(lVar3 / 10) * -10 + '0';
      uVar4 = lVar3 + 9;
      uVar7 = uVar6 - 1;
      uVar8 = uVar8 - 1;
      lVar3 = lVar3 / 10;
    } while (0x12 < uVar4);
    if ((int)uVar7 + 1 < 2) {
      pcVar5 = local_3a + uVar6 + 1;
    }
    else {
      pcVar5 = local_3a + (uVar7 - uVar8) + 1;
      memset(pcVar5,0x30,uVar7 & 0xffffffff);
    }
    std::__cxx11::string::append((char *)out,(ulong)pcVar5);
    if (v != 0) {
      std::__cxx11::string::push_back((char)out);
      pcVar2 = Format64((char *)&local_38,width,v);
      pcVar5 = local_3a + 1;
      do {
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + -1;
      } while (cVar1 == '0');
      std::__cxx11::string::append((char *)out,(ulong)pcVar2);
    }
    std::__cxx11::string::append((char *)out,(ulong)unit.abbr._M_str);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = std::round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, static_cast<size_t>(ep - bp));
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, static_cast<size_t>(ep - bp));
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}